

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.cpp
# Opt level: O3

void ScanAnalyse(fstream *file)

{
  char cVar1;
  byte bVar2;
  _Alloc_hider _Var3;
  size_type sVar4;
  int iVar5;
  uint uVar6;
  mapped_type *pmVar7;
  long *plVar8;
  undefined8 *puVar9;
  ostream *poVar10;
  mapped_type *pmVar11;
  long *plVar12;
  ulong uVar13;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 uVar14;
  size_type *psVar15;
  uint uVar16;
  uint uVar17;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  int iVar19;
  uint uVar20;
  ulong uVar21;
  byte bVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  bool bVar26;
  string __str_3;
  string buffer;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string str;
  ofstream resultFile;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  key_type local_2e8;
  long *local_2c8;
  long local_2c0;
  long local_2b8;
  long lStack_2b0;
  undefined1 *local_2a8 [2];
  undefined1 local_298 [16];
  size_type local_288;
  ulong local_280;
  ulong local_278;
  string local_270;
  string local_250;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  std::ofstream::ofstream(&local_230,"C:\\Code\\C\\clion\\LR1\\token.txt",_S_out);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"into scan...",0xc);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
  std::ostream::put('`');
  std::ostream::flush();
  ScanByChar_abi_cxx11_(&local_270,file);
  local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8);
  local_288 = local_270._M_string_length;
  if (0 < (int)(uint)local_270._M_string_length) {
    local_278 = (ulong)((uint)local_270._M_string_length & 0x7fffffff);
    iVar19 = 0;
    do {
      paVar18 = &local_308.field_2;
      lVar24 = (long)iVar19;
      bVar22 = local_270._M_dataplus._M_p[lVar24];
      std::__cxx11::string::_M_replace
                ((ulong)&local_2e8,0,(char *)local_2e8._M_string_length,0x10e0dd);
      if (Space[0] == bVar22) {
LAB_0010b855:
        iVar19 = iVar19 + 1;
      }
      else {
        uVar13 = 0xffffffffffffffff;
        do {
          if (uVar13 == 2) goto LAB_0010b50d;
          uVar21 = uVar13 + 1;
          lVar25 = uVar13 + 2;
          uVar13 = uVar21;
        } while (Space[lVar25] != bVar22);
        if (uVar21 < 3) goto LAB_0010b855;
LAB_0010b50d:
        if (Divide[0] == bVar22) {
LAB_0010b51a:
          std::__cxx11::string::push_back((char)&local_2e8);
          local_2a8[0] = local_298;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_2a8,local_2e8._M_dataplus._M_p,
                     (char *)(local_2e8._M_string_length + (long)local_2e8._M_dataplus._M_p));
          std::__cxx11::string::append((char *)local_2a8);
          pmVar7 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](&relatemap_abi_cxx11_,&local_2e8);
          plVar8 = (long *)std::__cxx11::string::_M_append
                                     ((char *)local_2a8,(ulong)(pmVar7->_M_dataplus)._M_p);
          plVar12 = plVar8 + 2;
          if ((long *)*plVar8 == plVar12) {
            local_2b8 = *plVar12;
            lStack_2b0 = plVar8[3];
            local_2c8 = &local_2b8;
          }
          else {
            local_2b8 = *plVar12;
            local_2c8 = (long *)*plVar8;
          }
          local_2c0 = plVar8[1];
          *plVar8 = (long)plVar12;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          plVar8 = (long *)std::__cxx11::string::append((char *)&local_2c8);
          psVar15 = (size_type *)(plVar8 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar15) {
            local_308.field_2._M_allocated_capacity = *psVar15;
            local_308.field_2._8_8_ = plVar8[3];
            local_308._M_dataplus._M_p = (pointer)paVar18;
          }
          else {
            local_308.field_2._M_allocated_capacity = *psVar15;
            local_308._M_dataplus._M_p = (pointer)*plVar8;
          }
          local_308._M_string_length = plVar8[1];
          *plVar8 = (long)psVar15;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,local_308._M_dataplus._M_p,
                               local_308._M_string_length);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
          std::ostream::put((char)poVar10);
          std::ostream::flush();
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_308._M_dataplus._M_p != paVar18) {
            operator_delete(local_308._M_dataplus._M_p);
          }
          if (local_2c8 != &local_2b8) {
            operator_delete(local_2c8);
          }
          if (local_2a8[0] != local_298) {
            operator_delete(local_2a8[0]);
          }
          pmVar11 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    ::operator[](&sortmap_abi_cxx11_,&local_2e8);
          if (list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_finish ==
              list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&list1,
                       (iterator)
                       list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,pmVar11);
          }
          else {
            *list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish = *pmVar11;
            list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish + 1;
          }
          local_308._M_dataplus._M_p = (pointer)paVar18;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_308,"NONE","");
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &list2_abi_cxx11_,&local_308);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_308._M_dataplus._M_p != paVar18) {
            operator_delete(local_308._M_dataplus._M_p);
          }
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_230,local_2e8._M_dataplus._M_p,
                               local_2e8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
          goto LAB_0010b855;
        }
        uVar13 = 0xffffffffffffffff;
        do {
          if (uVar13 == 3) goto LAB_0010b5d3;
          uVar21 = uVar13 + 1;
          lVar25 = uVar13 + 2;
          uVar13 = uVar21;
        } while (Divide[lVar25] != bVar22);
        if (uVar21 < 4) goto LAB_0010b51a;
LAB_0010b5d3:
        if (Operate[0] == bVar22) {
LAB_0010b5e0:
          std::__cxx11::string::push_back((char)&local_2e8);
          bVar26 = true;
          if (Operate[0] != local_270._M_dataplus._M_p[lVar24 + 1]) {
            uVar13 = 0;
            do {
              uVar21 = uVar13;
              if (uVar21 == 3) break;
              uVar13 = uVar21 + 1;
            } while (Operate[uVar21 + 1] != local_270._M_dataplus._M_p[lVar24 + 1]);
            bVar26 = uVar21 < 3;
          }
          iVar5 = iVar19 + 1;
          if (!(bool)(bVar26 ^ 1U | (int)local_288 <= iVar19 + 1)) {
            std::__cxx11::string::push_back((char)&local_2e8);
            iVar5 = iVar19 + 2;
          }
          iVar19 = iVar5;
          local_2a8[0] = local_298;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_2a8,local_2e8._M_dataplus._M_p,
                     (char *)(local_2e8._M_string_length + (long)local_2e8._M_dataplus._M_p));
          std::__cxx11::string::append((char *)local_2a8);
          pmVar7 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](&relatemap_abi_cxx11_,&local_2e8);
          puVar9 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)local_2a8,(ulong)(pmVar7->_M_dataplus)._M_p);
          plVar8 = puVar9 + 2;
          if ((long *)*puVar9 == plVar8) {
            local_2b8 = *plVar8;
            lStack_2b0 = puVar9[3];
            local_2c8 = &local_2b8;
          }
          else {
            local_2b8 = *plVar8;
            local_2c8 = (long *)*puVar9;
          }
          local_2c0 = puVar9[1];
          *puVar9 = plVar8;
          puVar9[1] = 0;
          *(undefined1 *)(puVar9 + 2) = 0;
          puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_2c8);
          psVar15 = puVar9 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar9 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar15) {
            local_308.field_2._M_allocated_capacity = *psVar15;
            local_308.field_2._8_8_ = puVar9[3];
            local_308._M_dataplus._M_p = (pointer)paVar18;
          }
          else {
            local_308.field_2._M_allocated_capacity = *psVar15;
            local_308._M_dataplus._M_p = (pointer)*puVar9;
          }
          local_308._M_string_length = puVar9[1];
          *puVar9 = psVar15;
          puVar9[1] = 0;
          *(undefined1 *)(puVar9 + 2) = 0;
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,local_308._M_dataplus._M_p,
                               local_308._M_string_length);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
          std::ostream::put((char)poVar10);
          std::ostream::flush();
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_308._M_dataplus._M_p != paVar18) {
            operator_delete(local_308._M_dataplus._M_p);
          }
          if (local_2c8 != &local_2b8) {
            operator_delete(local_2c8);
          }
          if (local_2a8[0] != local_298) {
            operator_delete(local_2a8[0]);
          }
          pmVar11 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    ::operator[](&sortmap_abi_cxx11_,&local_2e8);
          if (list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_finish ==
              list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&list1,
                       (iterator)
                       list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,pmVar11);
          }
          else {
            *list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish = *pmVar11;
            list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish + 1;
          }
          local_308._M_dataplus._M_p = (pointer)paVar18;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_308,"NONE","");
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &list2_abi_cxx11_,&local_308);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_308._M_dataplus._M_p != paVar18) {
            operator_delete(local_308._M_dataplus._M_p);
          }
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_230,local_2e8._M_dataplus._M_p,
                               local_2e8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
        }
        else {
          uVar13 = 0xffffffffffffffff;
          do {
            if (uVar13 == 2) goto LAB_0010b89d;
            uVar21 = uVar13 + 1;
            lVar25 = uVar13 + 2;
            uVar13 = uVar21;
          } while (Operate[lVar25] != bVar22);
          if (uVar21 < 3) goto LAB_0010b5e0;
LAB_0010b89d:
          if ((byte)(bVar22 - 0x30) < 10) {
            std::__cxx11::string::push_back((char)&local_2e8);
            sVar4 = local_288;
            bVar22 = local_270._M_dataplus._M_p[lVar24 + 1];
            lVar24 = lVar24 + 1;
            iVar5 = (int)lVar24;
            if (Space[0] != bVar22) {
              bVar2 = 1;
              do {
                iVar5 = (int)lVar24;
                uVar13 = 0;
                do {
                  uVar21 = uVar13;
                  if (uVar21 == 3) break;
                  uVar13 = uVar21 + 1;
                } while (Space[uVar21 + 1] != bVar22);
                if (!(bool)((iVar5 < (int)sVar4 && 2 < uVar21) & bVar2)) break;
                std::__cxx11::string::push_back((char)&local_2e8);
                if (((9 < (byte)(bVar22 - 0x30)) && (bVar22 != 0x2e)) && ((bVar22 & 0xdf) != 0x45))
                {
                  std::__cxx11::string::_M_erase
                            ((ulong)&local_2e8,(ulong)(local_2e8._M_string_length + -1));
                  bVar2 = 0;
                  iVar5 = iVar19;
                }
                iVar19 = iVar5;
                bVar22 = local_270._M_dataplus._M_p[(long)iVar19 + 1];
                lVar24 = (long)iVar19 + 1;
                iVar5 = (int)lVar24;
              } while (Space[0] != bVar22);
            }
            iVar19 = iVar5;
            local_2a8[0] = local_298;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_2a8,local_2e8._M_dataplus._M_p,
                       (char *)(local_2e8._M_string_length + (long)local_2e8._M_dataplus._M_p));
            std::__cxx11::string::append((char *)local_2a8);
            puVar9 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)local_2a8,(ulong)local_2e8._M_dataplus._M_p);
            plVar8 = puVar9 + 2;
            if ((long *)*puVar9 == plVar8) {
              local_2b8 = *plVar8;
              lStack_2b0 = puVar9[3];
              local_2c8 = &local_2b8;
            }
            else {
              local_2b8 = *plVar8;
              local_2c8 = (long *)*puVar9;
            }
            local_2c0 = puVar9[1];
            *puVar9 = plVar8;
            puVar9[1] = 0;
            *(undefined1 *)(puVar9 + 2) = 0;
            puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_2c8);
            psVar15 = puVar9 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar9 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar15) {
              local_308.field_2._M_allocated_capacity = *psVar15;
              local_308.field_2._8_8_ = puVar9[3];
              local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
            }
            else {
              local_308.field_2._M_allocated_capacity = *psVar15;
              local_308._M_dataplus._M_p = (pointer)*puVar9;
            }
            local_308._M_string_length = puVar9[1];
            *puVar9 = psVar15;
            puVar9[1] = 0;
            *(undefined1 *)(puVar9 + 2) = 0;
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,local_308._M_dataplus._M_p,
                                 local_308._M_string_length);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
            std::ostream::put((char)poVar10);
            std::ostream::flush();
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_308._M_dataplus._M_p != &local_308.field_2) {
              operator_delete(local_308._M_dataplus._M_p);
            }
            if (local_2c8 != &local_2b8) {
              operator_delete(local_2c8);
            }
            if (local_2a8[0] != local_298) {
              operator_delete(local_2a8[0]);
            }
            local_308._M_dataplus._M_p._0_4_ = 9;
            if (list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_finish ==
                list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage) {
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        (&list1,(iterator)
                                list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish,(int *)&local_308);
            }
            else {
              *list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_finish = 9;
              list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_finish = list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish + 1;
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"iConst",6);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230," ",1);
            if (table_abi_cxx11_.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish ==
                table_abi_cxx11_.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start) {
LAB_0010c0e5:
              uVar16 = -sortNumber;
              if (0 < sortNumber) {
                uVar16 = sortNumber;
              }
              uVar17 = 1;
              if (9 < uVar16) {
                uVar13 = (ulong)uVar16;
                uVar20 = 4;
                do {
                  uVar17 = uVar20;
                  uVar6 = (uint)uVar13;
                  if (uVar6 < 100) {
                    uVar17 = uVar17 - 2;
                    goto LAB_0010c7a7;
                  }
                  if (uVar6 < 1000) {
                    uVar17 = uVar17 - 1;
                    goto LAB_0010c7a7;
                  }
                  if (uVar6 < 10000) goto LAB_0010c7a7;
                  uVar13 = uVar13 / 10000;
                  uVar20 = uVar17 + 4;
                } while (99999 < uVar6);
                uVar17 = uVar17 + 1;
              }
LAB_0010c7a7:
              uVar20 = (uint)sortNumber >> 0x1f;
              local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
              std::__cxx11::string::_M_construct
                        ((ulong)&local_308,(char)uVar17 - (char)(sortNumber >> 0x1f));
              std::__detail::__to_chars_10_impl<unsigned_int>
                        (local_308._M_dataplus._M_p + uVar20,uVar17,uVar16);
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &list2_abi_cxx11_,&local_308);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_308._M_dataplus._M_p != &local_308.field_2) {
                operator_delete(local_308._M_dataplus._M_p);
              }
              sortNumber = sortNumber + 1;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(&table_abi_cxx11_,&local_2e8);
            }
            else {
              uVar21 = 0;
              uVar13 = 0;
              do {
                sVar4 = local_2e8._M_string_length;
                _Var3._M_p = local_2e8._M_dataplus._M_p;
                lVar24 = (long)table_abi_cxx11_.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)table_abi_cxx11_.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                psVar15 = &table_abi_cxx11_.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar21]._M_string_length;
                local_280 = uVar13;
                while (((char *)sVar4 != (char *)*psVar15 ||
                       (((char *)sVar4 != (char *)0x0 &&
                        (iVar5 = bcmp(_Var3._M_p,
                                      (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)(psVar15 + -1))->_M_dataplus)._M_p,sVar4), iVar5 != 0))))
                      ) {
                  uVar21 = uVar21 + 1;
                  psVar15 = psVar15 + 4;
                  if ((ulong)(lVar24 >> 5) <= uVar21) {
                    if ((local_280 & 1) != 0) goto LAB_0010b85b;
                    goto LAB_0010c0e5;
                  }
                }
                uVar16 = 1;
                if (9 < uVar21) {
                  uVar17 = 4;
                  uVar13 = uVar21;
                  do {
                    uVar16 = uVar17;
                    uVar20 = (uint)uVar13;
                    if (uVar20 < 100) {
                      uVar16 = uVar16 - 2;
                      goto LAB_0010c052;
                    }
                    if (uVar20 < 1000) {
                      uVar16 = uVar16 - 1;
                      goto LAB_0010c052;
                    }
                    if (uVar20 < 10000) goto LAB_0010c052;
                    uVar13 = (uVar13 & 0xffffffff) / 10000;
                    uVar17 = uVar16 + 4;
                  } while (99999 < uVar20);
                  uVar16 = uVar16 + 1;
                }
LAB_0010c052:
                local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
                std::__cxx11::string::_M_construct((ulong)&local_308,(char)uVar16);
                std::__detail::__to_chars_10_impl<unsigned_int>
                          (local_308._M_dataplus._M_p,uVar16,(uint)uVar21);
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           &list2_abi_cxx11_,&local_308);
                uVar14 = extraout_RDX;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_308._M_dataplus._M_p != &local_308.field_2) {
                  operator_delete(local_308._M_dataplus._M_p);
                  uVar14 = extraout_RDX_00;
                }
                uVar21 = uVar21 + 1;
                uVar13 = CONCAT71((int7)((ulong)uVar14 >> 8),1);
              } while (uVar21 < (ulong)((long)table_abi_cxx11_.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)table_abi_cxx11_.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start >> 5));
            }
          }
          else if (bVar22 == 0x5f || (byte)((bVar22 & 0xdf) + 0xbf) < 0x1a) {
            std::__cxx11::string::push_back((char)&local_2e8);
            lVar24 = (long)(iVar19 + 1);
            while( true ) {
              lVar23 = lVar24 + 1;
              bVar22 = local_270._M_dataplus._M_p[lVar24];
              lVar25 = lVar23;
              if (Space[0] == bVar22) break;
              uVar13 = 0;
              do {
                uVar21 = uVar13;
                if (uVar21 == 3) break;
                uVar13 = uVar21 + 1;
              } while (Space[uVar21 + 1] != bVar22);
              if (((uVar21 < 3) || ((long)local_278 <= lVar23)) ||
                 ((9 < (byte)(bVar22 - 0x30) &&
                  ((bVar22 != 0x5f && (lVar25 = lVar24, 0x19 < (byte)((bVar22 & 0xdf) + 0xbf)))))))
              break;
              std::__cxx11::string::push_back((char)&local_2e8);
              lVar24 = lVar23;
            }
            iVar19 = (int)lVar25;
            local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_250,local_2e8._M_dataplus._M_p,
                       (char *)(local_2e8._M_string_length + (long)local_2e8._M_dataplus._M_p));
            bVar26 = IsKeyword(&local_250);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_250._M_dataplus._M_p != &local_250.field_2) {
              operator_delete(local_250._M_dataplus._M_p);
            }
            local_2a8[0] = local_298;
            if (bVar26) {
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_2a8,local_2e8._M_dataplus._M_p,
                         (char *)(local_2e8._M_string_length + (long)local_2e8._M_dataplus._M_p));
              paVar18 = &local_308.field_2;
              std::__cxx11::string::append((char *)local_2a8);
              puVar9 = (undefined8 *)
                       std::__cxx11::string::_M_append
                                 ((char *)local_2a8,(ulong)local_2e8._M_dataplus._M_p);
              plVar8 = puVar9 + 2;
              if ((long *)*puVar9 == plVar8) {
                local_2b8 = *plVar8;
                lStack_2b0 = puVar9[3];
                local_2c8 = &local_2b8;
              }
              else {
                local_2b8 = *plVar8;
                local_2c8 = (long *)*puVar9;
              }
              local_2c0 = puVar9[1];
              *puVar9 = plVar8;
              puVar9[1] = 0;
              *(undefined1 *)(puVar9 + 2) = 0;
              puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_2c8);
              psVar15 = puVar9 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar9 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar15) {
                local_308.field_2._M_allocated_capacity = *psVar15;
                local_308.field_2._8_8_ = puVar9[3];
                local_308._M_dataplus._M_p = (pointer)paVar18;
              }
              else {
                local_308.field_2._M_allocated_capacity = *psVar15;
                local_308._M_dataplus._M_p = (pointer)*puVar9;
              }
              local_308._M_string_length = puVar9[1];
              *puVar9 = psVar15;
              puVar9[1] = 0;
              *(undefined1 *)(puVar9 + 2) = 0;
              poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,local_308._M_dataplus._M_p,
                                   local_308._M_string_length);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
              std::ostream::put((char)poVar10);
              std::ostream::flush();
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_308._M_dataplus._M_p != paVar18) {
                operator_delete(local_308._M_dataplus._M_p);
              }
              if (local_2c8 != &local_2b8) {
                operator_delete(local_2c8);
              }
              if (local_2a8[0] != local_298) {
                operator_delete(local_2a8[0]);
              }
              pmVar11 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                        ::operator[](&sortmap_abi_cxx11_,&local_2e8);
              if (list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          ((vector<int,std::allocator<int>> *)&list1,
                           (iterator)
                           list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish,pmVar11);
              }
              else {
                *list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                 ._M_finish = *pmVar11;
                list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_finish = list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish + 1;
              }
              local_308._M_dataplus._M_p = (pointer)paVar18;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_308,"NONE","");
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &list2_abi_cxx11_,&local_308);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_308._M_dataplus._M_p != paVar18) {
                operator_delete(local_308._M_dataplus._M_p);
              }
              poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&local_230,local_2e8._M_dataplus._M_p,
                                   local_2e8._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
            }
            else {
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_2a8,local_2e8._M_dataplus._M_p,
                         (char *)(local_2e8._M_string_length + (long)local_2e8._M_dataplus._M_p));
              std::__cxx11::string::append((char *)local_2a8);
              puVar9 = (undefined8 *)
                       std::__cxx11::string::_M_append
                                 ((char *)local_2a8,(ulong)local_2e8._M_dataplus._M_p);
              plVar8 = puVar9 + 2;
              if ((long *)*puVar9 == plVar8) {
                local_2b8 = *plVar8;
                lStack_2b0 = puVar9[3];
                local_2c8 = &local_2b8;
              }
              else {
                local_2b8 = *plVar8;
                local_2c8 = (long *)*puVar9;
              }
              local_2c0 = puVar9[1];
              *puVar9 = plVar8;
              puVar9[1] = 0;
              *(undefined1 *)(puVar9 + 2) = 0;
              puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_2c8);
              psVar15 = puVar9 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar9 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar15) {
                local_308.field_2._M_allocated_capacity = *psVar15;
                local_308.field_2._8_8_ = puVar9[3];
                local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
              }
              else {
                local_308.field_2._M_allocated_capacity = *psVar15;
                local_308._M_dataplus._M_p = (pointer)*puVar9;
              }
              local_308._M_string_length = puVar9[1];
              *puVar9 = psVar15;
              puVar9[1] = 0;
              *(undefined1 *)(puVar9 + 2) = 0;
              poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,local_308._M_dataplus._M_p,
                                   local_308._M_string_length);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
              std::ostream::put((char)poVar10);
              std::ostream::flush();
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_308._M_dataplus._M_p != &local_308.field_2) {
                operator_delete(local_308._M_dataplus._M_p);
              }
              if (local_2c8 != &local_2b8) {
                operator_delete(local_2c8);
              }
              if (local_2a8[0] != local_298) {
                operator_delete(local_2a8[0]);
              }
              local_308._M_dataplus._M_p._0_4_ = 1;
              if (list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          (&list1,(iterator)
                                  list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_finish,(int *)&local_308);
              }
              else {
                *list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                 ._M_finish = 1;
                list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_finish = list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish + 1;
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"id",2);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230," ",1);
              if (table_abi_cxx11_.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish ==
                  table_abi_cxx11_.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
LAB_0010c6bd:
                uVar16 = -sortNumber;
                if (0 < sortNumber) {
                  uVar16 = sortNumber;
                }
                uVar17 = 1;
                if (9 < uVar16) {
                  uVar13 = (ulong)uVar16;
                  uVar20 = 4;
                  do {
                    uVar17 = uVar20;
                    uVar6 = (uint)uVar13;
                    if (uVar6 < 100) {
                      uVar17 = uVar17 - 2;
                      goto LAB_0010c824;
                    }
                    if (uVar6 < 1000) {
                      uVar17 = uVar17 - 1;
                      goto LAB_0010c824;
                    }
                    if (uVar6 < 10000) goto LAB_0010c824;
                    uVar13 = uVar13 / 10000;
                    uVar20 = uVar17 + 4;
                  } while (99999 < uVar6);
                  uVar17 = uVar17 + 1;
                }
LAB_0010c824:
                uVar20 = (uint)sortNumber >> 0x1f;
                local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
                std::__cxx11::string::_M_construct
                          ((ulong)&local_308,(char)uVar17 - (char)(sortNumber >> 0x1f));
                std::__detail::__to_chars_10_impl<unsigned_int>
                          (local_308._M_dataplus._M_p + uVar20,uVar17,uVar16);
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           &list2_abi_cxx11_,&local_308);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_308._M_dataplus._M_p != &local_308.field_2) {
                  operator_delete(local_308._M_dataplus._M_p);
                }
                sortNumber = sortNumber + 1;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back(&table_abi_cxx11_,&local_2e8);
              }
              else {
                uVar21 = 0;
                uVar13 = 0;
                do {
                  sVar4 = local_2e8._M_string_length;
                  _Var3._M_p = local_2e8._M_dataplus._M_p;
                  lVar24 = (long)table_abi_cxx11_.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)table_abi_cxx11_.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start;
                  psVar15 = &table_abi_cxx11_.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar21]._M_string_length;
                  local_280 = uVar13;
                  while (((char *)sVar4 != (char *)*psVar15 ||
                         (((char *)sVar4 != (char *)0x0 &&
                          (iVar5 = bcmp(_Var3._M_p,
                                        (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)(psVar15 + -1))->_M_dataplus)._M_p,sVar4), iVar5 != 0))
                         ))) {
                    uVar21 = uVar21 + 1;
                    psVar15 = psVar15 + 4;
                    if ((ulong)(lVar24 >> 5) <= uVar21) {
                      if ((local_280 & 1) != 0) goto LAB_0010b85b;
                      goto LAB_0010c6bd;
                    }
                  }
                  uVar16 = 1;
                  if (9 < uVar21) {
                    uVar17 = 4;
                    uVar13 = uVar21;
                    do {
                      uVar16 = uVar17;
                      uVar20 = (uint)uVar13;
                      if (uVar20 < 100) {
                        uVar16 = uVar16 - 2;
                        goto LAB_0010c62a;
                      }
                      if (uVar20 < 1000) {
                        uVar16 = uVar16 - 1;
                        goto LAB_0010c62a;
                      }
                      if (uVar20 < 10000) goto LAB_0010c62a;
                      uVar13 = (uVar13 & 0xffffffff) / 10000;
                      uVar17 = uVar16 + 4;
                    } while (99999 < uVar20);
                    uVar16 = uVar16 + 1;
                  }
LAB_0010c62a:
                  local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
                  std::__cxx11::string::_M_construct((ulong)&local_308,(char)uVar16);
                  std::__detail::__to_chars_10_impl<unsigned_int>
                            (local_308._M_dataplus._M_p,uVar16,(uint)uVar21);
                  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  emplace_back<std::__cxx11::string>
                            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                             &list2_abi_cxx11_,&local_308);
                  uVar14 = extraout_RDX_01;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_308._M_dataplus._M_p != &local_308.field_2) {
                    operator_delete(local_308._M_dataplus._M_p);
                    uVar14 = extraout_RDX_02;
                  }
                  uVar21 = uVar21 + 1;
                  uVar13 = CONCAT71((int7)((ulong)uVar14 >> 8),1);
                } while (uVar21 < (ulong)((long)table_abi_cxx11_.
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)table_abi_cxx11_.
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start >> 5));
              }
            }
          }
          else {
            std::__cxx11::string::push_back((char)&local_2e8);
            cVar1 = local_270._M_dataplus._M_p[lVar24 + 1];
            std::__cxx11::string::push_back((char)&local_2e8);
            iVar19 = iVar19 + 2;
            if (iVar19 < (int)local_288) {
              bVar22 = (cVar1 == '*') + 1;
              lVar24 = (long)iVar19;
              do {
                cVar1 = local_270._M_dataplus._M_p[lVar24];
                std::__cxx11::string::push_back((char)&local_2e8);
                if (bVar22 == 3) {
                  bVar22 = cVar1 == '*' | 2;
                  if (cVar1 == '/') {
                    bVar22 = 4;
                  }
                }
                else if (bVar22 == 2) {
                  bVar22 = cVar1 == '*' | 2;
                }
                iVar19 = iVar19 + 1;
              } while ((lVar24 + 1 < (long)local_278) && (lVar24 = lVar24 + 1, bVar22 != 4));
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"annotation:",0xb);
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,local_2e8._M_dataplus._M_p,
                                 local_2e8._M_string_length);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
            std::ostream::put((char)poVar10);
            std::ostream::flush();
          }
        }
      }
LAB_0010b85b:
    } while (iVar19 < (int)local_288);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
    operator_delete(local_2e8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p);
  }
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = __filebuf;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void ScanAnalyse(fstream &file) {
    ofstream resultFile("C:\\Code\\C\\clion\\LR1\\token.txt");
    cout << "into scan..." << endl;
    string str = ScanByChar(file);
    int pos = 0;
    int length = str.length();
    char ch;
    string buffer = "";
    int state = 0;
    while (pos < length) {
        ch = str[pos];
        buffer = "";
        if (IsSpace(ch)) { pos++; }
        else if (IsDivide(ch)) {
            buffer += ch;
            pos++;
            cout << buffer + "  <" + relatemap[buffer] + ", _>" << endl;
            list1.push_back(sortmap[buffer]);
            list2.push_back("NONE");
            resultFile << buffer << " ";
            //tokenmap.insert( pair<int,string>(sortmap[buffer],"NONE") );
        } else if (IsOperate(ch)) {
            buffer += ch;
            pos++;
            if (IsOperate(ch = str[pos]) && pos < length) {
                buffer += ch;
                pos++;
            } else {
            }
            cout << buffer + "  <" + relatemap[buffer] + ", _>" << endl;
            list1.push_back(sortmap[buffer]);
            list2.push_back("NONE");
            resultFile << buffer << " ";
            //tokenmap.insert( pair<int,string>(sortmap[buffer],"NONE") );
        } else if (IsDigit(ch)) {
            state = 1;
            buffer += ch;
            pos++;
            bool flag = true;
            while (!IsSpace(ch = str[pos]) && pos < length && flag) {
                buffer += ch;
                switch (state) {
                    case 1:
                        if (IsDigit(ch)) state = 1;
                        else if (ch == '.') state = 2;
                        else if (ch == 'E' || ch == 'e') state = 4;
                        else {
                            pos--;
                            buffer.erase(buffer.end() - 1);
                            flag = false;
                        }
                        break;
                    case 2:
                        if (IsDigit(ch)) state = 3;
                        else {
                            pos--;
                            buffer.erase(buffer.end() - 1);
                            flag = false;
                        }
                        break;
                    case 3:
                        if (IsDigit(ch)) state = 3;
                        else if (ch == 'E' || ch == 'e') state = 4;
                        else {
                            pos--;
                            buffer.erase(buffer.end() - 1);
                            flag = false;
                        }
                        break;
                    case 4:
                        if (ch == '+' || ch == '-') state = 5;
                        else if (IsDigit(ch)) state = 6;
                        else {
                            pos--;
                            buffer.erase(buffer.end() - 1);
                            flag = false;
                        }
                        break;
                    case 5:
                        if (IsDigit(ch)) state = 6;
                        else {
                            pos--;
                            buffer.erase(buffer.end() - 1);
                            flag = false;
                        }
                        break;
                    case 6:
                        if (IsDigit(ch)) state = 6;
                        else {
                            pos--;
                            buffer.erase(buffer.end() - 1);
                            flag = false;
                        }
                        break;
                    default:
                        pos--;
                        flag = false;
                        buffer.erase(buffer.end() - 1);
                        cout << "error!" << endl;
                        break;
                }
                pos++;
            }
            cout << buffer + " <CONST," + buffer + ">" << endl;
            list1.push_back(9);
            resultFile << "iConst" << " ";
            bool flag2 = false;
            int i = 0;
            for (i = 0; i < table.size(); i++) {
                if (buffer == table[i]) {
                    list2.push_back(to_string(i));
                    flag2 = true;
                }
            }
            if (!flag2) {
                list2.push_back(to_string(sortNumber));
                sortNumber++;
                table.push_back(buffer);
            }
        } else if (IsLetter(ch) || ch == '_') {
            buffer += ch;
            pos++;
            while (!IsSpace(ch = str[pos++]) && pos < length) {
                if (IsLetter(ch) || ch == '_' || IsDigit(ch)) {
                    buffer += ch;
                } else {
                    //fseek(fp,-1L,SEEK_CUR);
                    //fp.seekg(0,ios::cur);
                    pos--;
                    break;
                }
            }
            if (IsKeyword(buffer)) {
                cout << buffer + " <" + buffer + ",_>" << endl;
                list1.push_back(sortmap[buffer]);
                list2.push_back("NONE");
                resultFile << buffer << " ";
            } else {
                cout << buffer + " <IDN," + buffer + ">" << endl;
                list1.push_back(1);
                resultFile << "id" << " ";
                bool flag = false;
                int i = 0;
                for (i = 0; i < table.size(); i++) {
                    if (buffer == table[i]) {
                        list2.push_back(to_string(i));
                        flag = true;
                    }
                }
                if (!flag) {
                    list2.push_back(to_string(sortNumber));
                    sortNumber++;
                    table.push_back(buffer);
                }
            }
        } else if ("/") {
            state = 1;
            buffer += ch;
            pos++;
            ch = str[pos++];
            buffer += ch;
            if (ch == '*') {
                state = 2;
            }
            while (pos < length && state != 4) {
                ch = str[pos++];
                buffer += ch;
                switch (state) {
                    case 2:
                        if (ch == '*') {
                            state = 3;
                        } else {}
                        break;
                    case 3:
                        if (ch == '/') {
                            state = 4;
                        } else if (ch == '*') {
                        } else {
                            state = 2;
                        }
                        break;
                    case 4:
                        break;
                }
            }
            cout << "annotation:" << buffer << endl;
        }
    }
}